

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

bool anon_unknown.dwarf_1ba5c07::isSameStructUnion(Type *left,Type *right)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  Type *right_00;
  FieldSymbol *pFVar2;
  specific_symbol_iterator<slang::ast::FieldSymbol> lhs;
  Type *in_RSI;
  Type *rft;
  Type *lft;
  specific_symbol_iterator<slang::ast::FieldSymbol> rit;
  specific_symbol_iterator<slang::ast::FieldSymbol> lit;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  rr;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  lr;
  Type *rt;
  Type *lt;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  Type *in_stack_ffffffffffffff60;
  Scope *in_stack_ffffffffffffff70;
  size_t sVar3;
  char *pcVar4;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  local_48;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  local_38;
  Type *local_28;
  bool local_1;
  
  right_00 = slang::ast::Type::getCanonicalType(in_stack_ffffffffffffff60);
  local_28 = slang::ast::Type::getCanonicalType(in_stack_ffffffffffffff60);
  if ((right_00->super_Symbol).kind == (local_28->super_Symbol).kind) {
    if (((right_00->super_Symbol).kind == PackedStructType) ||
       ((right_00->super_Symbol).kind == PackedUnionType)) {
      slang::ast::Symbol::as<slang::ast::Scope>((Symbol *)0xbaa618);
      local_38 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>
                           (in_stack_ffffffffffffff70);
      slang::ast::Symbol::as<slang::ast::Scope>((Symbol *)0xbaa637);
      local_48 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>
                           (in_stack_ffffffffffffff70);
      std::ranges::
      subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
      ::begin(&local_38);
      std::ranges::
      subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
      ::begin(&local_48);
      while( true ) {
        std::ranges::
        subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
        ::end(&local_38);
        bVar1 = slang::
                operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                          ((self_type *)in_stack_ffffffffffffff60,
                           (specific_symbol_iterator<slang::ast::FieldSymbol> *)
                           CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        std::ranges::
        subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
        ::end(&local_48);
        bVar1 = slang::
                operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                          ((self_type *)in_stack_ffffffffffffff60,
                           (specific_symbol_iterator<slang::ast::FieldSymbol> *)
                           CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff5f = 1;
        if (!bVar1) {
          pFVar2 = slang::
                   iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                   ::operator->((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                                 *)0xbaa6c5);
          sVar3 = (pFVar2->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
          pcVar4 = (pFVar2->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
          pFVar2 = slang::
                   iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                   ::operator->((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                                 *)0xbaa6e1);
          __y._M_len = (pFVar2->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
          __y._M_str = (pFVar2->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
          __x._M_str = pcVar4;
          __x._M_len = sVar3;
          bVar1 = std::operator==(__x,__y);
          in_stack_ffffffffffffff5f = bVar1 ^ 0xff;
        }
        if ((in_stack_ffffffffffffff5f & 1) != 0) {
          return false;
        }
        slang::
        iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
        ::operator->((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                      *)0xbaa733);
        slang::ast::ValueSymbol::getType((ValueSymbol *)0xbaa73b);
        slang::
        iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
        ::operator->((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                      *)0xbaa74a);
        slang::ast::ValueSymbol::getType((ValueSymbol *)0xbaa752);
        bVar1 = slang::ast::Type::isMatching(lft,rft);
        if ((!bVar1) && (bVar1 = isSameStructUnion(in_RSI,right_00), !bVar1)) {
          return false;
        }
        slang::
        iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
        ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                  ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                    *)in_stack_ffffffffffffff60);
        slang::
        iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
        ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                  ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                    *)in_stack_ffffffffffffff60);
      }
      lhs = std::ranges::
            subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
            ::end(&local_48);
      local_1 = slang::
                operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                          ((self_type *)lhs.current,
                           (specific_symbol_iterator<slang::ast::FieldSymbol> *)
                           CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool isSameStructUnion(const Type& left, const Type& right) {
    const Type& lt = left.getCanonicalType();
    const Type& rt = right.getCanonicalType();
    if (lt.kind != rt.kind)
        return false;

    if (lt.kind != SymbolKind::PackedStructType && lt.kind != SymbolKind::PackedUnionType)
        return false;

    auto lr = lt.as<Scope>().membersOfType<FieldSymbol>();
    auto rr = rt.as<Scope>().membersOfType<FieldSymbol>();

    auto lit = lr.begin();
    auto rit = rr.begin();
    while (lit != lr.end()) {
        if (rit == rr.end() || lit->name != rit->name)
            return false;

        auto& lft = lit->getType();
        auto& rft = rit->getType();
        if (!lft.isMatching(rft) && !isSameStructUnion(lft, rft))
            return false;

        ++lit;
        ++rit;
    }
    return rit == rr.end();
}